

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O0

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinR2SCAN_C,void>::
eval_exc_vxc_<int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&,double*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinR2SCAN_C,_void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6,
          double **args_7,double **args_8,double **args_9)

{
  bool bVar1;
  const_host_buffer_type in_RCX;
  undefined8 in_RDX;
  int N;
  host_buffer_type unaff_RBX;
  BuiltinKernel *in_RDI;
  const_host_buffer_type in_R8;
  const_host_buffer_type in_R9;
  host_buffer_type unaff_retaddr;
  host_buffer_type in_stack_00000008;
  const_host_buffer_type in_stack_00000050;
  int in_stack_0000005c;
  host_buffer_type in_stack_00000088;
  
  N = (int)((ulong)in_RDX >> 0x20);
  bVar1 = BuiltinKernel::is_polarized(in_RDI);
  if (bVar1) {
    host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinR2SCAN_C>
              (in_stack_0000005c,in_stack_00000050,(const_host_buffer_type)this,
               (const_host_buffer_type)args,(const_host_buffer_type)args_1,(host_buffer_type)args_2,
               (host_buffer_type)args_7,(host_buffer_type)args_8,(host_buffer_type)args_9,
               in_stack_00000088);
  }
  else {
    host_eval_exc_vxc_helper_unpolar<ExchCXX::BuiltinR2SCAN_C>
              (N,in_RCX,in_R8,in_R9,*args_3,*args_4,(host_buffer_type)in_RDI,unaff_RBX,unaff_retaddr
               ,in_stack_00000008);
  }
  return;
}

Assistant:

void eval_exc_vxc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }